

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O0

void __thiscall wasm::UnneededSetRemover::visitLocalSet(UnneededSetRemover *this,LocalSet *curr)

{
  reference pvVar1;
  LocalSet *pLVar2;
  LocalGet *pLVar3;
  LocalGet *get;
  LocalSet *set;
  Expression *value;
  LocalSet *curr_local;
  UnneededSetRemover *this_local;
  
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->localGetCounter->num,(ulong)curr->index);
  if (*pvVar1 == 0) {
    remove(this,(char *)curr);
  }
  set = (LocalSet *)curr->value;
  while( true ) {
    pLVar2 = Expression::dynCast<wasm::LocalSet>((Expression *)set);
    if (pLVar2 == (LocalSet *)0x0) {
      pLVar3 = Expression::dynCast<wasm::LocalGet>((Expression *)set);
      if ((pLVar3 != (LocalGet *)0x0) && (pLVar3->index == curr->index)) {
        remove(this,(char *)curr);
      }
      return;
    }
    if (pLVar2->index == curr->index) break;
    set = (LocalSet *)pLVar2->value;
  }
  remove(this,(char *)curr);
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // If no possible uses, remove.
    if (localGetCounter->num[curr->index] == 0) {
      remove(curr);
    }
    // If setting the same value as we already have, remove.
    auto* value = curr->value;
    while (true) {
      if (auto* set = value->dynCast<LocalSet>()) {
        if (set->index == curr->index) {
          remove(curr);
        } else {
          // Handle tee chains.
          value = set->value;
          continue;
        }
      } else if (auto* get = value->dynCast<LocalGet>()) {
        if (get->index == curr->index) {
          remove(curr);
        }
      }
      break;
    }
  }